

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O1

void __thiscall coins_tests::ccoins_flush_behavior::test_method(ccoins_flush_behavior *this)

{
  CCoinsViewCacheTest *baseIn;
  DBParams db_params;
  __uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  _Var1;
  unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  *view;
  long in_FS_OFFSET;
  CoinsViewOptions options;
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  caches;
  CCoinsViewDB base;
  undefined8 in_stack_ffffffffffffff18;
  __uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  in_stack_ffffffffffffff20;
  pointer puVar2;
  pointer in_stack_ffffffffffffff30;
  pointer puVar3;
  _List in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff40 [16];
  CCoinsViewDB local_88;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = (pointer)0xf710a4;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            ((path *)&stack0xffffffffffffff40,(char **)&stack0xffffffffffffff28,auto_format);
  db_params.path.super_path._M_pathname._M_string_length =
       (size_type)
       in_stack_ffffffffffffff20._M_t.
       super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
       .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl;
  db_params.path.super_path._M_pathname._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff18;
  db_params.path.super_path._M_pathname.field_2._M_allocated_capacity = (size_type)puVar2;
  db_params.path.super_path._M_pathname.field_2._8_8_ = in_stack_ffffffffffffff30;
  db_params.path.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       in_stack_ffffffffffffff38._M_impl._M_t.
       super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
       ._M_t.
       super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
       .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
  db_params.cache_bytes = in_stack_ffffffffffffff40._0_8_;
  db_params.memory_only = (bool)in_stack_ffffffffffffff40[8];
  db_params.wipe_data = (bool)in_stack_ffffffffffffff40[9];
  db_params.obfuscate = (bool)in_stack_ffffffffffffff40[10];
  db_params.options.force_compact = (bool)in_stack_ffffffffffffff40[0xb];
  db_params._52_4_ = in_stack_ffffffffffffff40._12_4_;
  options._8_8_ = 0x1000000;
  options.batch_write_bytes = (size_t)&stack0xffffffffffffff40;
  CCoinsViewDB::CCoinsViewDB(&local_88,db_params,options);
  std::filesystem::__cxx11::path::~path((path *)&stack0xffffffffffffff40);
  puVar2 = (pointer)0x0;
  puVar3 = (pointer)0x0;
  _Var1._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl =
       (tuple<(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
        )operator_new(0x1c8);
  CCoinsViewCache::CCoinsViewCache
            ((CCoinsViewCache *)
             _Var1._M_t.
             super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
             .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
             _M_head_impl,&local_88.super_CCoinsView,false);
  *(undefined ***)
   _Var1._M_t.
   super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
   .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl =
       &PTR_GetCoin_013ad110;
  std::
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ::push_back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
               *)&stack0xffffffffffffff28,(value_type *)&stack0xffffffffffffff20);
  if ((__uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
       )_Var1._M_t.
        super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
        .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
       )0x0) {
    (**(code **)(*(long *)_Var1._M_t.
                          super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                          .
                          super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                          ._M_head_impl + 0x38))();
  }
  baseIn = puVar3[-1]._M_t.
           super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
           ._M_t.
           super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
           .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl;
  _Var1._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl =
       (tuple<(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
        )operator_new(0x1c8);
  CCoinsViewCache::CCoinsViewCache
            ((CCoinsViewCache *)
             _Var1._M_t.
             super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
             .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
             _M_head_impl,(CCoinsView *)baseIn,false);
  *(undefined ***)
   _Var1._M_t.
   super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
   .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl =
       &PTR_GetCoin_013ad110;
  std::
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ::push_back((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
               *)&stack0xffffffffffffff28,(value_type *)&stack0xffffffffffffff20);
  if ((__uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
       )_Var1._M_t.
        super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
        .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
       )0x0) {
    (**(code **)(*(long *)_Var1._M_t.
                          super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                          .
                          super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                          ._M_head_impl + 0x38))();
  }
  if (puVar2 != puVar3) {
    do {
      FlushTest::TestFlushBehavior
                (&this->super_FlushTest,
                 (puVar2->_M_t).
                 super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                 .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                 _M_head_impl,&local_88,
                 (vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                  *)&stack0xffffffffffffff28,false);
      FlushTest::TestFlushBehavior
                (&this->super_FlushTest,
                 (puVar2->_M_t).
                 super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                 .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                 _M_head_impl,&local_88,
                 (vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                  *)&stack0xffffffffffffff28,true);
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar3);
  }
  std::
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ::~vector((vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
             *)&stack0xffffffffffffff28);
  std::unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_>::~unique_ptr(&local_88.m_db);
  std::filesystem::__cxx11::path::~path((path *)&local_88.m_db_params);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(ccoins_flush_behavior, FlushTest)
{
    // Create two in-memory caches atop a leveldb view.
    CCoinsViewDB base{{.path = "test", .cache_bytes = 1 << 23, .memory_only = true}, {}};
    std::vector<std::unique_ptr<CCoinsViewCacheTest>> caches;
    caches.push_back(std::make_unique<CCoinsViewCacheTest>(&base));
    caches.push_back(std::make_unique<CCoinsViewCacheTest>(caches.back().get()));

    for (const auto& view : caches) {
        TestFlushBehavior(view.get(), base, caches, /*do_erasing_flush=*/false);
        TestFlushBehavior(view.get(), base, caches, /*do_erasing_flush=*/true);
    }
}